

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O3

void output_comment_bytes(Context_conflict2 *ctx,uint8 *buf,size_t len)

{
  undefined8 in_RAX;
  anon_union_4_2_62d8b094 overflow;
  undefined8 uStack_28;
  
  if (0x3fffc < len) {
    failf(ctx,"%s","Comment field is too big");
    return;
  }
  if (ctx->isfail == 0) {
    uStack_28 = in_RAX;
    output_token_noswap(ctx,((((uint)(len >> 2) & 0x3fffffff) + 1) - (uint)((len & 3) == 0)) *
                            0x10000 | 0xfffe);
    if (3 < len) {
      do {
        output_token_noswap(ctx,*(uint32 *)buf);
        len = len - 4;
        buf = (uint8 *)((long)buf + 4);
      } while (3 < len);
    }
    if (len != 0) {
      uStack_28 = (ulong)(uint)uStack_28;
      memcpy((void *)((long)&uStack_28 + 4),buf,len);
      output_token_noswap(ctx,uStack_28._4_4_);
    }
  }
  return;
}

Assistant:

static void output_comment_bytes(Context *ctx, const uint8 *buf, size_t len)
{
    if (len > (0xFFFF * 4))  // length is stored as token count, in 16 bits.
        fail(ctx, "Comment field is too big");
    else if (!isfail(ctx))
    {
        const uint32 tokencount = (len / 4) + ((len % 4) ? 1 : 0);
        output_token(ctx, 0xFFFE | (tokencount << 16));
        while (len >= 4)
        {
            output_token_noswap(ctx, *((const uint32 *) buf));
            len -= 4;
            buf += 4;
        } // while

        if (len > 0)  // handle spillover...
        {
            union { uint8 ui8[4]; uint32 ui32; } overflow;
            overflow.ui32 = 0;
            memcpy(overflow.ui8, buf, len);
            output_token_noswap(ctx, overflow.ui32);
        } // if
    } // else if
}